

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O3

void __thiscall PruneReplayer::access_descriptor_set(PruneReplayer *this,Hash hash)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  VkDescriptorSetLayoutBinding *pVVar1;
  uint uVar2;
  const_iterator cVar3;
  mapped_type *ppVVar4;
  ulong uVar5;
  __hashtable *__h_1;
  mapped_type pVVar6;
  uint32_t i;
  ulong uVar7;
  ulong uVar8;
  __hashtable *__h;
  __node_gen_type __node_gen;
  Hash local_50;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_48;
  mapped_type local_40;
  VkSampler local_38;
  
  if (hash != 0) {
    this_00 = &this->accessed_descriptor_sets;
    local_50 = hash;
    cVar3 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&this_00->_M_h,&local_50);
    if (cVar3.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
      local_48 = &this_00->_M_h;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)this_00,&local_50);
      ppVVar4 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkDescriptorSetLayoutCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkDescriptorSetLayoutCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkDescriptorSetLayoutCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkDescriptorSetLayoutCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->descriptor_sets,&local_50);
      pVVar6 = *ppVVar4;
      if ((pVVar6 != (mapped_type)0x0) && (uVar2 = pVVar6->bindingCount, uVar2 != 0)) {
        uVar8 = 0;
        local_40 = pVVar6;
        do {
          pVVar1 = pVVar6->pBindings;
          if (pVVar1[uVar8].pImmutableSamplers != (VkSampler *)0x0) {
            uVar5 = (ulong)pVVar1[uVar8].descriptorCount;
            if (pVVar1[uVar8].descriptorCount != 0) {
              uVar7 = 0;
              do {
                local_38 = pVVar1[uVar8].pImmutableSamplers[uVar7];
                if (local_38 != (VkSampler)0x0) {
                  local_48 = &(this->accessed_samplers)._M_h;
                  std::
                  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                            ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)&this->accessed_samplers,&local_38,&local_48);
                  uVar5 = (ulong)pVVar1[uVar8].descriptorCount;
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 < uVar5);
              uVar2 = local_40->bindingCount;
              pVVar6 = local_40;
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar2);
      }
    }
  }
  return;
}

Assistant:

void access_descriptor_set(Hash hash)
	{
		if (!hash)
			return;
		if (accessed_descriptor_sets.count(hash))
			return;
		accessed_descriptor_sets.insert(hash);

		auto *create_info = descriptor_sets[hash];
		if (!create_info)
			return;

		for (uint32_t binding = 0; binding < create_info->bindingCount; binding++)
		{
			auto &bind = create_info->pBindings[binding];
			if (bind.pImmutableSamplers && bind.descriptorCount != 0)
			{
				for (uint32_t i = 0; i < bind.descriptorCount; i++)
					if (bind.pImmutableSamplers[i] != VK_NULL_HANDLE)
						access_sampler((Hash)bind.pImmutableSamplers[i]);
			}
		}
	}